

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O2

void emit_byte(int val,j_compress_ptr cinfo)

{
  size_t *psVar1;
  jpeg_destination_mgr *pjVar2;
  JOCTET *pJVar3;
  jpeg_error_mgr *pjVar4;
  boolean bVar5;
  
  pjVar2 = cinfo->dest;
  pJVar3 = pjVar2->next_output_byte;
  pjVar2->next_output_byte = pJVar3 + 1;
  *pJVar3 = (JOCTET)val;
  psVar1 = &pjVar2->free_in_buffer;
  *psVar1 = *psVar1 - 1;
  if (*psVar1 == 0) {
    bVar5 = (*pjVar2->empty_output_buffer)(cinfo);
    if (bVar5 == 0) {
      pjVar4 = cinfo->err;
      pjVar4->msg_code = 0x18;
      (*pjVar4->error_exit)((j_common_ptr)cinfo);
      return;
    }
  }
  return;
}

Assistant:

LOCAL(void)
emit_byte(int val, j_compress_ptr cinfo)
/* Write next output byte; we do not support suspension in this module. */
{
  struct jpeg_destination_mgr *dest = cinfo->dest;

  *dest->next_output_byte++ = (JOCTET)val;
  if (--dest->free_in_buffer == 0)
    if (!(*dest->empty_output_buffer) (cinfo))
      ERREXIT(cinfo, JERR_CANT_SUSPEND);
}